

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
                 *handler)

{
  byte bVar1;
  dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  *pdVar2;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *pbVar3;
  dynamic_format_specs<char> *pdVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pdVar2 = handler->handler;
    pbVar3 = pdVar2->context_;
    uVar7 = pbVar3->next_arg_id_;
    if ((int)uVar7 < 0) {
      error_handler::on_error
                ((error_handler *)pbVar3,"cannot switch from manual to automatic argument indexing")
      ;
      uVar7 = 0;
    }
    else {
      pbVar3->next_arg_id_ = uVar7 + 1;
    }
    pdVar4 = pdVar2->specs_;
    (pdVar4->precision_ref).kind = INDEX;
    (pdVar4->precision_ref).field_1.index = uVar7;
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      uVar7 = 0;
      pbVar6 = (byte *)begin;
      if (bVar1 != 0x30) {
        do {
          if (0xccccccc < uVar7) {
            begin = (char *)(pbVar6 + -1);
            uVar7 = 0x80000000;
            goto LAB_001d2b62;
          }
          uVar7 = ((uint)bVar1 + uVar7 * 10) - 0x30;
          begin = end;
          if (pbVar6 == (byte *)end) break;
          bVar1 = *pbVar6;
          begin = (char *)pbVar6;
          pbVar6 = pbVar6 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        if ((int)uVar7 < 0) {
LAB_001d2b62:
          error_handler::on_error((error_handler *)handler->handler->context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == 0x3a || (*begin == 0x7d)))) {
        pdVar2 = handler->handler;
        pbVar3 = pdVar2->context_;
        if (pbVar3->next_arg_id_ < 1) {
          pbVar3->next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)pbVar3,
                     "cannot switch from automatic to manual argument indexing");
        }
        pdVar4 = pdVar2->specs_;
        (pdVar4->precision_ref).kind = INDEX;
        (pdVar4->precision_ref).field_1.index = uVar7;
        return (char *)(byte *)begin;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar6 = (byte *)(begin + 1);
      do {
        pbVar5 = pbVar6;
        pbVar8 = (byte *)end;
        if (pbVar5 == (byte *)end) break;
        bVar1 = *pbVar5;
        pbVar6 = pbVar5 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar8 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      pdVar4 = handler->handler->specs_;
      (pdVar4->precision_ref).kind = NAME;
      (pdVar4->precision_ref).field_1.name.value = begin;
      (pdVar4->precision_ref).field_1.name.size = (long)pbVar8 - (long)begin;
      return (char *)pbVar8;
    }
    error_handler::on_error((error_handler *)handler->handler->context_,"invalid format string");
  }
  return (char *)(byte *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}